

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generic_writer.cc
# Opt level: O0

char * tcmalloc::DoWithWriterToStrDup
                 (ChunkedWriterConfig *config,_func_void_GenericWriter_ptr_void_ptr *body,void *arg)

{
  char *pcVar1;
  undefined1 local_58 [8];
  ChunkedStorageWriter writer;
  ChunkedStorage storage;
  void *arg_local;
  _func_void_GenericWriter_ptr_void_ptr *body_local;
  ChunkedWriterConfig *config_local;
  
  anon_unknown_0::ChunkedStorage::ChunkedStorage((ChunkedStorage *)&writer.storage_,config);
  anon_unknown_0::ChunkedStorageWriter::ChunkedStorageWriter
            ((ChunkedStorageWriter *)local_58,(ChunkedStorage *)&writer.storage_);
  (*body)((GenericWriter *)local_58,arg);
  anon_unknown_0::ChunkedStorageWriter::~ChunkedStorageWriter((ChunkedStorageWriter *)local_58);
  pcVar1 = anon_unknown_0::ChunkedStorage::StrDupAndRelease((ChunkedStorage *)&writer.storage_);
  anon_unknown_0::ChunkedStorage::~ChunkedStorage((ChunkedStorage *)&writer.storage_);
  return pcVar1;
}

Assistant:

char* DoWithWriterToStrDup(const ChunkedWriterConfig& config, void (*body)(GenericWriter* writer, void* arg), void* arg) {
  ChunkedStorage storage(config);
  {
    ChunkedStorageWriter writer{&storage};
    body(&writer, arg);
    // Ensure writer is destroyed and releases it's entire output
    // into storage.
  }
  return storage.StrDupAndRelease();
}